

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

SpatialMatrix *
RigidBodyDynamics::Math::Xrotz_mat(SpatialMatrix *__return_storage_ptr__,Scalar *zrot)

{
  double dVar1;
  double dVar2;
  undefined4 local_28;
  undefined4 uStack_24;
  
  dVar1 = sin(*zrot);
  dVar2 = cos(*zrot);
  local_28 = SUB84(dVar1,0);
  uStack_24 = (undefined4)((ulong)dVar1 >> 0x20);
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = dVar2;
  *(undefined4 *)
   ((__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 6) =
       local_28;
  *(undefined4 *)
   ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x34
   ) = uStack_24;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = -dVar1;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = dVar2;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x12] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x13] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x14] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x19] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1a] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1f] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x20] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe] = 1.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x15] = dVar2;
  *(undefined4 *)
   ((__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x1b) =
       local_28;
  *(undefined4 *)
   ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0xdc
   ) = uStack_24;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x16] = -dVar1
  ;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1c] = dVar2;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x21] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x22] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x10] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x11] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x17] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x18] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1d] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1e] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x23] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI SpatialMatrix Xrotz_mat (const Scalar &zrot) {
  Scalar s, c;
  s = sin (zrot);
  c = cos (zrot);

  return SpatialMatrix(
      c,     s,    0.,  0.,  0.,  0.,
      -s,     c,    0.,  0.,  0.,  0.,
      0.,    0.,    1.,  0.,  0.,  0.,
      0.,    0.,    0.,   c,   s,  0.,
      0.,    0.,    0.,  -s,   c,  0.,
      0.,    0.,    0.,  0.,  0.,  1.
      );
}